

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::file_rename_failed_alert::~file_rename_failed_alert(file_rename_failed_alert *this)

{
  file_rename_failed_alert *this_local;
  
  ~file_rename_failed_alert(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

struct TORRENT_EXPORT file_rename_failed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT file_rename_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, file_index_t idx
			, error_code ec);

		TORRENT_DEFINE_ALERT_PRIO(file_rename_failed_alert, 8, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;

		std::string message() const override;

		// refers to the index of the file that was supposed to be renamed,
		// ``error`` is the error code returned from the filesystem.
		file_index_t const index;
		error_code const error;
	}